

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O2

Vec_Int_t * Llb_ManMarkPivotNodes(Aig_Man_t *p,int fUseInternal)

{
  undefined1 *puVar1;
  void *pvVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar4);
    *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) | 0x10;
  }
  for (iVar4 = 0; iVar4 < p->nRegs; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar4);
    *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) | 0x10;
  }
  if (fUseInternal != 0) {
    Llb_ManMarkInternalPivots(p);
  }
  puVar1 = &p->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffffffffef;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar4);
    Vec_IntPush(p_00,*(int *)((long)pvVar2 + 0x24));
  }
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,iVar4);
    if (((pvVar2 != (void *)0x0) && ((*(ulong *)((long)pvVar2 + 0x18) & 0x10) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
      Vec_IntPush(p_00,*(int *)((long)pvVar2 + 0x24));
    }
  }
  for (iVar4 = 0; iVar4 < p->nRegs; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar4);
    Vec_IntPush(p_00,*(int *)((long)pvVar2 + 0x24));
  }
  return p_00;
}

Assistant:

Vec_Int_t * Llb_ManMarkPivotNodes( Aig_Man_t * p, int fUseInternal )
{
    Vec_Int_t * vVar2Obj;
    Aig_Obj_t * pObj;
    int i;
    // mark inputs/outputs
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = 1;
    Saig_ManForEachLi( p, pObj, i )
        pObj->fMarkA = 1;

    // mark internal pivot nodes
    if ( fUseInternal )
        Llb_ManMarkInternalPivots( p );

    // assign variable numbers
    Aig_ManConst1(p)->fMarkA = 0;
    vVar2Obj = Vec_IntAlloc( 100 );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    Aig_ManForEachNode( p, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    return vVar2Obj;
}